

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_linux_server_socket.c
# Opt level: O1

void test_accept_eventloop_add_fails(void)

{
  cio_address_family family;
  cio_error cVar1;
  cio_inet_address *inet_address;
  cio_server_socket ss;
  cio_socket_address endpoint;
  cio_eventloop loop;
  
  cio_linux_eventloop_add_fake.return_val = CIO_INVALID_ARGUMENT;
  alloc_client_fake.custom_fake = alloc_success;
  free_client_fake.custom_fake = free_success;
  inet_address = cio_get_inet_address_any4();
  cio_init_inet_socket_address(&endpoint,inet_address,0x3039);
  family = cio_socket_address_get_family(&endpoint);
  cVar1 = cio_server_socket_init(&ss,&loop,5,family,alloc_client,free_client,10,on_close);
  UnityAssertEqualNumber
            (0,(long)cVar1,"Initialization of server socket failed!",0x20a,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_bind(&ss,&endpoint);
  UnityAssertEqualNumber
            (0,(long)cVar1,"call to bind() did not succeed!",0x20d,UNITY_DISPLAY_STYLE_INT);
  cVar1 = cio_server_socket_accept(&ss,accept_handler,(void *)0x0);
  if (cVar1 != CIO_SUCCESS) {
    UnityAssertEqualNumber
              (0,(ulong)accept_handler_fake.call_count,(char *)0x0,0x211,UNITY_DISPLAY_STYLE_INT);
    cio_server_socket_close(&ss);
    return;
  }
  UnityFail(" Expression Evaluated To FALSE",0x210);
}

Assistant:

static void test_accept_eventloop_add_fails(void)
{
	cio_linux_eventloop_add_fake.return_val = CIO_INVALID_ARGUMENT;

	struct cio_eventloop loop;
	struct cio_server_socket ss;

	alloc_client_fake.custom_fake = alloc_success;
	free_client_fake.custom_fake = free_success;

	struct cio_socket_address endpoint;
	fill_inet_socket_address(&endpoint);

	enum cio_error err = cio_server_socket_init(&ss, &loop, 5, cio_socket_address_get_family(&endpoint), alloc_client, free_client, 10, on_close);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Initialization of server socket failed!");

	err = cio_server_socket_bind(&ss, &endpoint);
	TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "call to bind() did not succeed!");

	err = cio_server_socket_accept(&ss, accept_handler, NULL);
	TEST_ASSERT(err != CIO_SUCCESS);
	TEST_ASSERT_EQUAL(0, accept_handler_fake.call_count);
	cio_server_socket_close(&ss);
}